

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlidna.cpp
# Opt level: O0

void qt_punycodeEncoder(QStringView in,QString *output)

{
  QStringView string;
  QStringView string_00;
  QStringView string_01;
  QLatin1StringView str;
  bool bVar1;
  enable_if_t<std::is_unsigned_v<unsigned_int>____std::is_signed_v<unsigned_int>,_bool> eVar2;
  enable_if_t<std::is_unsigned_v<unsigned_int>,_bool> eVar3;
  int iVar4;
  uint uVar5;
  char32_t cVar6;
  qsizetype qVar7;
  long lVar8;
  QChar *pQVar9;
  const_iterator pvVar10;
  char16_t *pcVar11;
  char *str_00;
  QString *in_RDX;
  __off_t __length;
  __off_t __length_00;
  __off_t extraout_RDX;
  __off_t extraout_RDX_00;
  __off_t __length_01;
  __off_t __length_02;
  storage_type_conflict *in_RSI;
  qsizetype in_RDI;
  long in_FS_OFFSET;
  char32_t c_2;
  char32_t c_1;
  uint m;
  uint inputLength;
  uint h;
  uint b;
  int copied;
  const_iterator __end1;
  const_iterator __begin1;
  QStringView *__range1;
  bool skipped;
  QChar *d;
  int outLen;
  uint bias;
  uint n;
  QStringIterator iter_2;
  uint tmp;
  QStringIterator iter_1;
  QStringIterator iter;
  QChar c;
  uint delta;
  qsizetype in_stack_fffffffffffffeb8;
  QStringView *in_stack_fffffffffffffec0;
  QStringIterator *in_stack_fffffffffffffec8;
  QString *this;
  QString *pQVar12;
  char32_t local_f4;
  uint local_f0;
  uint local_ec;
  const_iterator local_d8;
  QString *local_c0;
  char32_t local_ac;
  uint local_74;
  qsizetype local_70;
  storage_type_conflict *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  qsizetype local_48;
  storage_type_conflict *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  QChar local_20;
  QChar local_1e;
  uint local_1c;
  QStringView local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_ac = L'\x80';
  local_1c = 0;
  local_18.m_size = in_RDI;
  local_18.m_data = in_RSI;
  qVar7 = QStringView::size(&local_18);
  if (qVar7 < 0x7f) {
    qVar7 = QString::size(in_RDX);
    iVar4 = (int)qVar7;
    lVar8 = (long)iVar4;
    pQVar12 = in_RDX;
    QStringView::size(&local_18);
    QString::resize((QString *)in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    pQVar9 = QString::data((QString *)in_stack_fffffffffffffec0);
    local_c0 = (QString *)(pQVar9 + iVar4);
    bVar1 = false;
    local_d8 = QStringView::begin((QStringView *)0x30d60b);
    pvVar10 = QStringView::end(in_stack_fffffffffffffec0);
    for (; local_d8 != pvVar10; local_d8 = local_d8 + 1) {
      local_1e.ucs = local_d8->ucs;
      pcVar11 = QChar::unicode(&local_1e);
      if ((ushort)*pcVar11 < 0x80) {
        *(char16_t *)&(local_c0->d).d = local_1e.ucs;
        local_c0 = (QString *)((long)&(local_c0->d).d + 2);
      }
      else {
        bVar1 = true;
      }
    }
    if (bVar1) {
      this = in_RDX;
      pQVar9 = QString::constData((QString *)0x30d6d5);
      QString::truncate(this,(char *)((long)local_c0 - (long)pQVar9 >> 1),__length);
      qVar7 = QString::size(in_RDX);
      uVar5 = (int)qVar7 - iVar4;
      if (uVar5 != 0) {
        QChar::QChar<char16_t,_true>(&local_20,L'-');
        QString::operator+=((QString *)in_stack_fffffffffffffec0,
                            (QChar)(char16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30));
      }
      local_f0 = 0;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = local_18.m_size;
      local_40 = local_18.m_data;
      string.m_data = (storage_type_conflict *)this;
      string.m_size = (qsizetype)local_c0;
      QStringIterator::QStringIterator
                (in_stack_fffffffffffffec8,string,(qsizetype)in_stack_fffffffffffffec0);
      do {
        bVar1 = QStringIterator::hasNext((QStringIterator *)0x30d7c7);
        local_ec = uVar5;
        if (!bVar1) goto LAB_0030d80d;
        local_f0 = local_f0 + 1;
        cVar6 = QStringIterator::next
                          (in_stack_fffffffffffffec8,
                           (char32_t)((ulong)in_stack_fffffffffffffec0 >> 0x20));
      } while (cVar6 != L'\xffffffff');
      QString::truncate(in_RDX,(char *)(long)iVar4,__length_00);
    }
  }
LAB_0030db0b:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
LAB_0030d80d:
  if (local_f0 <= local_ec) goto LAB_0030dabd;
  local_f4 = std::numeric_limits<unsigned_int>::max();
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = local_18.m_size;
  local_68 = local_18.m_data;
  string_00.m_data = (storage_type_conflict *)this;
  string_00.m_size = (qsizetype)local_c0;
  QStringIterator::QStringIterator
            (in_stack_fffffffffffffec8,string_00,(qsizetype)in_stack_fffffffffffffec0);
  while (bVar1 = QStringIterator::hasNext((QStringIterator *)0x30d89f), bVar1) {
    cVar6 = QStringIterator::nextUnchecked(in_stack_fffffffffffffec8);
    if (((uint)local_ac <= (uint)cVar6) && ((uint)cVar6 < (uint)local_f4)) {
      local_f4 = cVar6;
    }
  }
  local_74 = 0xaaaaaaaa;
  eVar2 = qMulOverflow<unsigned_int>(local_f4 - local_ac,local_ec + 1,&local_74);
  __length_01 = extraout_RDX;
  if ((eVar2) ||
     (eVar3 = qAddOverflow<unsigned_int>(local_1c,local_74,&local_1c), __length_01 = extraout_RDX_00
     , eVar3)) {
    QString::truncate(in_RDX,(char *)(long)iVar4,__length_01);
    goto LAB_0030db0b;
  }
  string_01.m_data = (storage_type_conflict *)this;
  string_01.m_size = (qsizetype)local_c0;
  QStringIterator::QStringIterator
            (in_stack_fffffffffffffec8,string_01,(qsizetype)in_stack_fffffffffffffec0);
  while (bVar1 = QStringIterator::hasNext((QStringIterator *)0x30d9c6), bVar1) {
    cVar6 = QStringIterator::nextUnchecked(in_stack_fffffffffffffec8);
    if (((uint)cVar6 < (uint)local_f4) &&
       (eVar3 = qAddOverflow<unsigned_int>(local_1c,1,&local_1c), eVar3)) {
      QString::truncate(in_RDX,(char *)(long)iVar4,__length_02);
      goto LAB_0030db0b;
    }
    if (cVar6 == local_f4) {
      appendEncode(local_c0,(uint)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                   (uint)in_stack_fffffffffffffec8);
      adapt(local_1c,local_ec + 1,local_ec == uVar5);
      local_1c = 0;
      local_ec = local_ec + 1;
    }
  }
  local_1c = local_1c + 1;
  local_ac = local_f4 + L'\x01';
  goto LAB_0030d80d;
LAB_0030dabd:
  str_00 = (char *)(long)iVar4;
  Qt::Literals::StringLiterals::operator____L1(str_00,(size_t)in_RDX);
  str.m_data = (char *)pQVar12;
  str.m_size = lVar8;
  QString::insert(local_c0,(qsizetype)str_00,str);
  goto LAB_0030db0b;
}

Assistant:

Q_AUTOTEST_EXPORT void qt_punycodeEncoder(QStringView in, QString *output)
{
    uint n = initial_n;
    uint delta = 0;
    uint bias = initial_bias;

    // Do not try to encode strings that certainly will result in output
    // that is longer than allowable domain name label length. Note that
    // non-BMP codepoints are encoded as two QChars.
    if (in.size() > MaxDomainLabelLength * 2)
        return;

    int outLen = output->size();
    output->resize(outLen + in.size());

    QChar *d = output->data() + outLen;
    bool skipped = false;
    // copy all basic code points verbatim to output.
    for (QChar c : in) {
        if (c.unicode() < 0x80)
            *d++ = c;
        else
            skipped = true;
    }

    // if there were only basic code points, just return them
    // directly; don't do any encoding.
    if (!skipped)
        return;

    output->truncate(d - output->constData());
    int copied = output->size() - outLen;

    // h and b now contain the number of basic code points in input.
    uint b = copied;
    uint h = copied;

    // if basic code points were copied, add the delimiter character.
    if (h > 0)
        *output += u'-';

    // compute the input length in Unicode code points.
    uint inputLength = 0;
    for (QStringIterator iter(in); iter.hasNext();) {
        inputLength++;

        if (iter.next(char32_t(-1)) == char32_t(-1)) {
            output->truncate(outLen);
            return; // invalid surrogate pair
        }
    }

    // while there are still unprocessed non-basic code points left in
    // the input string...
    while (h < inputLength) {
        // find the character in the input string with the lowest unprocessed value.
        uint m = std::numeric_limits<uint>::max();
        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();
            static_assert(std::numeric_limits<decltype(m)>::max()
                                  >= std::numeric_limits<decltype(c)>::max(),
                          "Punycode uint should be able to cover all codepoints");
            if (c >= n && c < m)
                m = c;
        }

        // delta = delta + (m - n) * (h + 1), fail on overflow
        uint tmp;
        if (qMulOverflow<uint>(m - n, h + 1, &tmp) || qAddOverflow<uint>(delta, tmp, &delta)) {
            output->truncate(outLen);
            return; // punycode_overflow
        }
        n = m;

        for (QStringIterator iter(in); iter.hasNext();) {
            auto c = iter.nextUnchecked();

            // increase delta until we reach the character processed in this iteration;
            // fail if delta overflows.
            if (c < n) {
                if (qAddOverflow<uint>(delta, 1, &delta)) {
                    output->truncate(outLen);
                    return; // punycode_overflow
                }
            }

            if (c == n) {
                appendEncode(output, delta, bias);

                bias = adapt(delta, h + 1, h == b);
                delta = 0;
                ++h;
            }
        }

        ++delta;
        ++n;
    }

    // prepend ACE prefix
    output->insert(outLen, "xn--"_L1);
    return;
}